

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_recv.c
# Opt level: O0

int mpt_outdata_recv(mpt_outdata *out)

{
  int iVar1;
  ssize_t sVar2;
  uint local_7c;
  int local_78;
  int post;
  int max;
  int len;
  msghdr mh;
  uint8_t *addr;
  iovec vec;
  mpt_buffer *buf;
  mpt_outdata *out_local;
  
  if ((out->sock)._id < 0) {
    out_local._4_4_ = 0xffffffff;
  }
  else if ((out->state & 0x10) == 0) {
    out->state = out->state & 0xdf;
    local_78 = 0x10000;
    local_7c = (uint)out->_idlen;
    if (local_7c != 0) {
      local_7c = (uint)out->_smax;
      local_78 = local_7c + 0x10000;
    }
    mh._48_8_ = mpt_array_slice(out,local_78,0);
    if ((uint8_t *)mh._48_8_ == (uint8_t *)0x0) {
      out_local._4_4_ = 0xfffffffc;
    }
    else {
      vec.iov_len = (size_t)(out->buf)._buf;
      vec.iov_base = (void *)((mpt_buffer *)vec.iov_len)->_size;
      _max = (uint8_t *)0x0;
      mh._8_8_ = &addr;
      mh.msg_iov = (iovec *)0x1;
      mh.msg_iovlen = 0;
      mh.msg_control = (void *)0x0;
      mh.msg_controllen._0_4_ = 0;
      mh.msg_name._0_4_ = local_7c;
      if (local_7c != 0) {
        _max = (uint8_t *)(mh._48_8_ + 0x10000);
        vec.iov_base = (void *)((long)vec.iov_base - (long)(int)local_7c);
      }
      addr = (uint8_t *)mh._48_8_;
      sVar2 = recvmsg((out->sock)._id,(msghdr *)&max,0);
      iVar1 = (int)sVar2;
      if (iVar1 < 0) {
        out_local._4_4_ = 0xfffffffc;
      }
      else if (iVar1 < (int)(uint)out->_idlen) {
        out_local._4_4_ = 0xfffffff0;
      }
      else {
        *(long *)(vec.iov_len + 0x18) = (long)iVar1;
        out->state = out->state | 0x20;
        out->_scurr = (uint8_t)(uint)mh.msg_name;
        if ((uint8_t)(uint)mh.msg_name != '\0') {
          memmove((void *)(mh._48_8_ + (long)iVar1),(void *)(mh._48_8_ + 0x10000),
                  (ulong)(uint)mh.msg_name);
        }
        out_local._4_4_ = local_7c;
      }
    }
  }
  else {
    out_local._4_4_ = 0xffffffdf;
  }
  return out_local._4_4_;
}

Assistant:

extern int mpt_outdata_recv(MPT_STRUCT(outdata) *out)
{
	MPT_STRUCT(buffer) *buf;
	struct iovec vec;
	uint8_t *addr;
	struct msghdr mh;
	int len, max, post;
	
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	if (out->state & MPT_OUTFLAG(Active)) {
		return MPT_MESGERR(InProgress);
	}
	out->state &= ~MPT_OUTFLAG(Received);
	
	/* UDP maxsize buffer */
#define MPT_MAX_UDP_SIZE 0x10000
	max = MPT_MAX_UDP_SIZE;
	if ((post = out->_idlen)) {
		post = out->_smax;
		max += post;
	}
	if (!(addr = mpt_array_slice(&out->buf, max, 0))) {
		return MPT_ERROR(BadOperation);
	}
	buf = out->buf._buf;
	
	vec.iov_base = addr;
	vec.iov_len  = buf->_size;
	
	/* message default setup */
	mh.msg_name = 0;
	mh.msg_namelen = 0;
	mh.msg_iov = &vec;
	mh.msg_iovlen = 1;
	mh.msg_control = 0;
	mh.msg_controllen = 0;
	mh.msg_flags = 0;
	
	if ((mh.msg_namelen = post)) {
		mh.msg_name = addr + MPT_MAX_UDP_SIZE;
		vec.iov_len -= post;
	}
	/* get data from socket */
	if ((len = recvmsg(out->sock._id, &mh, 0)) < 0) {
		return MPT_ERROR(BadOperation);
	}
	if (len < out->_idlen) {
		return MPT_ERROR(MissingData);
	}
	buf->_used = len;
	out->state |= MPT_OUTFLAG(Received);
	
	if ((out->_scurr = mh.msg_namelen)) {
		memmove(addr + len, addr + MPT_MAX_UDP_SIZE, mh.msg_namelen);
	}
	
	return post;
}